

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUIFileOpenDialog::CGUIFileOpenDialog
          (CGUIFileOpenDialog *this,wchar_t *title,IGUIEnvironment *environment,IGUIElement *parent,
          s32 id,bool restoreCWD,char_type *startDir)

{
  long *plVar1;
  rect<int> rectangle;
  int iVar2;
  undefined4 uVar3;
  EGUI_ALIGNMENT top;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  wchar_t *pwVar4;
  undefined4 extraout_var_02;
  wchar_t *pwVar5;
  undefined4 extraout_var_03;
  undefined8 uVar6;
  undefined4 extraout_var_04;
  IGUIElement *in_RCX;
  IGUIElement *in_RDI;
  byte in_R9B;
  long in_stack_00000008;
  s32 posx;
  s32 buttonw;
  IGUISkin *skin;
  SColor color;
  IGUISpriteBank *sprites;
  char *c;
  undefined8 in_stack_fffffffffffffe30;
  string<char> *other;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  rect<int> *in_stack_fffffffffffffe40;
  rect<int> *this_00;
  IGUIElement *in_stack_fffffffffffffe48;
  IGUIEnvironment *pIVar7;
  IGUIEnvironment *in_stack_fffffffffffffe50;
  void **in_stack_fffffffffffffe58;
  EGUI_ALIGNMENT in_stack_fffffffffffffe60;
  EGUI_ALIGNMENT in_stack_fffffffffffffe64;
  undefined8 in_stack_fffffffffffffe68;
  IGUIElement *in_stack_fffffffffffffe70;
  IGUIElement *this_01;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  CGUIFileOpenDialog *in_stack_fffffffffffffe80;
  wchar_t *local_170;
  int local_15c;
  undefined8 local_150;
  undefined1 local_114 [16];
  undefined1 local_104 [16];
  undefined1 local_f4 [16];
  undefined1 local_e4 [16];
  u32 local_d4;
  u32 local_d0;
  undefined1 local_cc [16];
  int local_bc;
  int local_b8;
  u32 local_b4;
  long *local_b0;
  SColor local_a4;
  long local_a0;
  undefined1 local_98 [32];
  rect<int> local_78;
  rect<int> local_68;
  rect<int> local_58;
  rect<int> local_48;
  char *local_38;
  string<char> *local_30;
  byte local_25;
  IGUIElement *local_20;
  
  local_25 = in_R9B & 1;
  local_20 = in_RCX;
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)&in_RDI[1].AlignLeft);
  local_48 = IGUIElement::getAbsolutePosition(local_20);
  core::rect<int>::getWidth(&local_48);
  local_58 = IGUIElement::getAbsolutePosition(local_20);
  core::rect<int>::getHeight(&local_58);
  local_68 = IGUIElement::getAbsolutePosition(local_20);
  core::rect<int>::getWidth(&local_68);
  local_78 = IGUIElement::getAbsolutePosition(local_20);
  core::rect<int>::getHeight(&local_78);
  core::rect<int>::rect
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
             (int)((ulong)in_stack_fffffffffffffe30 >> 0x20),(int)in_stack_fffffffffffffe30);
  rectangle.LowerRightCorner.X = in_stack_fffffffffffffe78;
  rectangle.UpperLeftCorner = (vector2d<int>)in_stack_fffffffffffffe70;
  rectangle.LowerRightCorner.Y = in_stack_fffffffffffffe7c;
  IGUIFileOpenDialog::IGUIFileOpenDialog
            ((IGUIFileOpenDialog *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             (s32)((ulong)in_stack_fffffffffffffe40 >> 0x20),rectangle);
  (in_RDI->super_IEventReceiver)._vptr_IEventReceiver = (_func_int **)0x446398;
  in_RDI[1].AlignLeft = 0x4464f0;
  in_RDI[1].AlignRight = EGUIA_UPPERLEFT;
  core::vector2d<int>::vector2d((vector2d<int> *)&in_RDI->field_0x134);
  core::string<char>::string((string<char> *)0x3b7091);
  core::string<wchar_t>::string((string<wchar_t> *)0x3b70a5);
  core::string<char>::string((string<char> *)0x3b70b9);
  core::string<char>::string((string<char> *)0x3b70cd);
  core::string<wchar_t>::string((string<wchar_t> *)0x3b70e1);
  core::string<char>::string((string<char> *)0x3b70f5);
  core::string<char>::string((string<char> *)0x3b7109);
  in_RDI[1].Name.str._M_string_length = 0;
  in_RDI[1].ID = 0;
  in_RDI[1].IsTabStop = false;
  *(undefined3 *)&in_RDI[1].field_0x10d = 0;
  *(undefined1 *)&in_RDI[1].TabOrder = 0;
  core::string<wchar_t>::operator=
            ((string<wchar_t> *)in_stack_fffffffffffffe48,(wchar_t *)in_stack_fffffffffffffe40);
  if (in_RDI->Environment == (IGUIEnvironment *)0x0) {
    local_150 = 0;
    c = local_38;
    other = local_30;
  }
  else {
    iVar2 = (*in_RDI->Environment->_vptr_IGUIEnvironment[7])();
    local_150 = CONCAT44(extraout_var,iVar2);
    c = local_38;
    other = local_30;
  }
  *(undefined8 *)((long)&in_RDI[1].Name.str.field_2 + 8) = local_150;
  if (*(long *)((long)&in_RDI[1].Name.str.field_2 + 8) != 0) {
    plVar1 = *(long **)((long)&in_RDI[1].Name.str.field_2 + 8);
    IReferenceCounted::grab((IReferenceCounted *)((long)plVar1 + *(long *)(*plVar1 + -0x18)));
    if ((local_25 & 1) != 0) {
      (**(code **)(**(long **)((long)&in_RDI[1].Name.str.field_2 + 8) + 0x88))();
      core::string<char>::operator=
                ((string<char> *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),other
                );
    }
    if (in_stack_00000008 != 0) {
      core::string<char>::operator=
                ((string<char> *)in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
      plVar1 = *(long **)((long)&in_RDI[1].Name.str.field_2 + 8);
      core::string<char>::string<char>(other,c);
      (**(code **)(*plVar1 + 0x90))(plVar1,local_98);
      core::string<char>::~string((string<char> *)0x3b7271);
    }
    local_a0 = 0;
    video::SColor::SColor(&local_a4,0xff,0xff,0xff,0xff);
    iVar2 = (*in_RDI->Environment->_vptr_IGUIEnvironment[0xc])();
    local_b0 = (long *)CONCAT44(extraout_var_00,iVar2);
    if (local_b0 != (long *)0x0) {
      local_a0 = (**(code **)(*local_b0 + 0x40))();
      local_b4 = (**(code **)*local_b0)(local_b0,0x12);
      local_a4.color = local_b4;
    }
    if (local_b0 == (long *)0x0) {
      local_15c = 2;
    }
    else {
      local_15c = (**(code **)(*local_b0 + 0x10))(local_b0,2);
    }
    local_b8 = local_15c;
    iVar2 = core::rect<int>::getWidth(&in_RDI->RelativeRect);
    local_bc = (iVar2 - local_b8) + -4;
    pIVar7 = in_RDI->Environment;
    core::rect<int>::rect
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
               (int)((ulong)other >> 0x20),(int)other);
    if (local_b0 == (long *)0x0) {
      local_170 = L"Close";
    }
    else {
      local_170 = (wchar_t *)(**(code **)(*local_b0 + 0x18))(local_b0,4);
    }
    iVar2 = (*pIVar7->_vptr_IGUIEnvironment[0x17])(pIVar7,local_cc,in_RDI,0xffffffff,L"",local_170);
    *(ulong *)&in_RDI[1].ToolTipText.field_0x8 = CONCAT44(extraout_var_01,iVar2);
    (**(code **)(**(long **)&in_RDI[1].ToolTipText.field_0x8 + 0x88))();
    IGUIElement::setTabStop(*(IGUIElement **)&in_RDI[1].ToolTipText.field_0x8,false);
    if ((local_a0 != 0) && (local_b0 != (long *)0x0)) {
      plVar1 = *(long **)&in_RDI[1].ToolTipText.field_0x8;
      (**(code **)(*plVar1 + 0x188))(plVar1,local_a0);
      in_stack_fffffffffffffe80 = *(CGUIFileOpenDialog **)&in_RDI[1].ToolTipText.field_0x8;
      uVar3 = (**(code **)(*local_b0 + 0x50))(local_b0,2);
      local_d0 = local_a4.color;
      (**(code **)(*(long *)in_stack_fffffffffffffe80 + 400))
                (in_stack_fffffffffffffe80,0,uVar3,local_a4.color,0);
      plVar1 = *(long **)&in_RDI[1].ToolTipText.field_0x8;
      uVar3 = (**(code **)(*local_b0 + 0x50))(local_b0,2);
      local_d4 = local_a4.color;
      (**(code **)(*plVar1 + 400))(plVar1,1,uVar3,local_a4.color,0);
    }
    IGUIElement::setAlignment
              (in_stack_fffffffffffffe70,(EGUI_ALIGNMENT)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               (EGUI_ALIGNMENT)in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
               in_stack_fffffffffffffe60);
    plVar1 = *(long **)&in_RDI[1].ToolTipText.field_0x8;
    IReferenceCounted::grab((IReferenceCounted *)((long)plVar1 + *(long *)(*plVar1 + -0x18)));
    this_01 = (IGUIElement *)in_RDI->Environment;
    core::rect<int>::getWidth(&in_RDI->RelativeRect);
    core::rect<int>::getWidth(&in_RDI->RelativeRect);
    core::rect<int>::rect
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
               (int)((ulong)other >> 0x20),(int)other);
    if (local_b0 == (long *)0x0) {
      pwVar4 = L"OK";
    }
    else {
      pwVar4 = (wchar_t *)(**(code **)(*local_b0 + 0x18))(local_b0,0);
    }
    iVar2 = (*(this_01->super_IEventReceiver)._vptr_IEventReceiver[0x17])
                      (this_01,local_e4,in_RDI,0xffffffff,pwVar4,0);
    *(ulong *)&in_RDI[1].ToolTipText.field_0x10 = CONCAT44(extraout_var_02,iVar2);
    plVar1 = *(long **)&in_RDI[1].ToolTipText.field_0x10;
    (**(code **)(*plVar1 + 0x88))(plVar1,1);
    IGUIElement::setAlignment
              (this_01,(EGUI_ALIGNMENT)((ulong)pwVar4 >> 0x20),(EGUI_ALIGNMENT)pwVar4,
               in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
    plVar1 = *(long **)&in_RDI[1].ToolTipText.field_0x10;
    IReferenceCounted::grab((IReferenceCounted *)((long)plVar1 + *(long *)(*plVar1 + -0x18)));
    pIVar7 = in_RDI->Environment;
    iVar2 = core::rect<int>::getWidth(&in_RDI->RelativeRect);
    top = iVar2 - 0x50;
    core::rect<int>::getWidth(&in_RDI->RelativeRect);
    core::rect<int>::rect
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
               (int)((ulong)other >> 0x20),(int)other);
    if (local_b0 == (long *)0x0) {
      pwVar5 = L"Cancel";
    }
    else {
      pwVar5 = (wchar_t *)(**(code **)(*local_b0 + 0x18))(local_b0,1);
    }
    iVar2 = (*pIVar7->_vptr_IGUIEnvironment[0x17])(pIVar7,local_f4,in_RDI,0xffffffff,pwVar5,0);
    *(ulong *)&in_RDI[1].ToolTipText.field_0x18 = CONCAT44(extraout_var_03,iVar2);
    plVar1 = *(long **)&in_RDI[1].ToolTipText.field_0x18;
    (**(code **)(*plVar1 + 0x88))(plVar1,1);
    IGUIElement::setAlignment
              (this_01,(EGUI_ALIGNMENT)((ulong)pwVar4 >> 0x20),(EGUI_ALIGNMENT)pwVar4,top,
               in_stack_fffffffffffffe60);
    plVar1 = *(long **)&in_RDI[1].ToolTipText.field_0x18;
    IReferenceCounted::grab((IReferenceCounted *)((long)plVar1 + *(long *)(*plVar1 + -0x18)));
    this_00 = (rect<int> *)in_RDI->Environment;
    core::rect<int>::getWidth(&in_RDI->RelativeRect);
    core::rect<int>::rect
              (this_00,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
               (int)((ulong)other >> 0x20),(int)other);
    uVar6 = (**(code **)((long)this_00->UpperLeftCorner + 0xe0))
                      (this_00,local_104,in_RDI,0xffffffff,1);
    *(undefined8 *)&in_RDI[1].Name.str = uVar6;
    plVar1 = *(long **)&in_RDI[1].Name.str;
    (**(code **)(*plVar1 + 0x88))(plVar1,1);
    IGUIElement::setAlignment
              (this_01,(EGUI_ALIGNMENT)((ulong)pwVar4 >> 0x20),(EGUI_ALIGNMENT)pwVar4,top,
               in_stack_fffffffffffffe60);
    plVar1 = *(long **)&in_RDI[1].Name.str;
    IReferenceCounted::grab((IReferenceCounted *)((long)plVar1 + *(long *)(*plVar1 + -0x18)));
    pIVar7 = in_RDI->Environment;
    core::rect<int>::getWidth(&in_RDI->RelativeRect);
    core::rect<int>::rect
              (this_00,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
               (int)((ulong)other >> 0x20),(int)other);
    iVar2 = (*pIVar7->_vptr_IGUIEnvironment[0x1f])(pIVar7,0,local_114,1,in_RDI,0xffffffff);
    in_RDI[1].Name.str._M_string_length = CONCAT44(extraout_var_04,iVar2);
    plVar1 = (long *)in_RDI[1].Name.str._M_string_length;
    (**(code **)(*plVar1 + 0x88))(plVar1,1);
    IGUIElement::setAlignment
              (this_01,(EGUI_ALIGNMENT)((ulong)pwVar4 >> 0x20),(EGUI_ALIGNMENT)pwVar4,top,
               in_stack_fffffffffffffe60);
    plVar1 = (long *)in_RDI[1].Name.str._M_string_length;
    IReferenceCounted::grab((IReferenceCounted *)((long)plVar1 + *(long *)(*plVar1 + -0x18)));
    IGUIElement::setTabGroup(in_RDI,true);
    fillListBox(in_stack_fffffffffffffe80);
  }
  return;
}

Assistant:

CGUIFileOpenDialog::CGUIFileOpenDialog(const wchar_t *title,
		IGUIEnvironment *environment, IGUIElement *parent, s32 id,
		bool restoreCWD, io::path::char_type *startDir) :
		IGUIFileOpenDialog(environment, parent, id,
				core::rect<s32>((parent->getAbsolutePosition().getWidth() - FOD_WIDTH) / 2,
						(parent->getAbsolutePosition().getHeight() - FOD_HEIGHT) / 2,
						(parent->getAbsolutePosition().getWidth() - FOD_WIDTH) / 2 + FOD_WIDTH,
						(parent->getAbsolutePosition().getHeight() - FOD_HEIGHT) / 2 + FOD_HEIGHT)),
		FileNameText(0), FileList(0), Dragging(false)
{
#ifdef _DEBUG
	IGUIElement::setDebugName("CGUIFileOpenDialog");
#endif

	Text = title;

	FileSystem = Environment ? Environment->getFileSystem() : 0;

	if (FileSystem) {
		FileSystem->grab();

		if (restoreCWD)
			RestoreDirectory = FileSystem->getWorkingDirectory();
		if (startDir) {
			StartDirectory = startDir;
			FileSystem->changeWorkingDirectoryTo(startDir);
		}
	} else
		return;

	IGUISpriteBank *sprites = 0;
	video::SColor color(255, 255, 255, 255);
	IGUISkin *skin = Environment->getSkin();
	if (skin) {
		sprites = skin->getSpriteBank();
		color = skin->getColor(EGDC_WINDOW_SYMBOL);
	}

	const s32 buttonw = skin ? skin->getSize(EGDS_WINDOW_BUTTON_WIDTH) : 2;
	const s32 posx = RelativeRect.getWidth() - buttonw - 4;

	CloseButton = Environment->addButton(core::rect<s32>(posx, 3, posx + buttonw, 3 + buttonw), this, -1,
			L"", skin ? skin->getDefaultText(EGDT_WINDOW_CLOSE) : L"Close");
	CloseButton->setSubElement(true);
	CloseButton->setTabStop(false);
	if (sprites && skin) {
		CloseButton->setSpriteBank(sprites);
		CloseButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_WINDOW_CLOSE), color);
		CloseButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_WINDOW_CLOSE), color);
	}
	CloseButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
	CloseButton->grab();

	OKButton = Environment->addButton(
			core::rect<s32>(RelativeRect.getWidth() - 80, 30, RelativeRect.getWidth() - 10, 50),
			this, -1, skin ? skin->getDefaultText(EGDT_MSG_BOX_OK) : L"OK");
	OKButton->setSubElement(true);
	OKButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
	OKButton->grab();

	CancelButton = Environment->addButton(
			core::rect<s32>(RelativeRect.getWidth() - 80, 55, RelativeRect.getWidth() - 10, 75),
			this, -1, skin ? skin->getDefaultText(EGDT_MSG_BOX_CANCEL) : L"Cancel");
	CancelButton->setSubElement(true);
	CancelButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
	CancelButton->grab();

	FileBox = Environment->addListBox(core::rect<s32>(10, 55, RelativeRect.getWidth() - 90, 230), this, -1, true);
	FileBox->setSubElement(true);
	FileBox->setAlignment(EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT);
	FileBox->grab();

	FileNameText = Environment->addEditBox(0, core::rect<s32>(10, 30, RelativeRect.getWidth() - 90, 50), true, this);
	FileNameText->setSubElement(true);
	FileNameText->setAlignment(EGUIA_UPPERLEFT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
	FileNameText->grab();

	setTabGroup(true);

	fillListBox();
}